

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool OverlapHelper(ON_RTreeBBox *a_rectA,ON_RTreeBBox *a_rectB)

{
  double *mx;
  double *mn;
  ON_RTreeBBox *a_rectB_local;
  ON_RTreeBBox *a_rectA_local;
  
  if (a_rectB->m_min[0] <= a_rectA->m_max[0]) {
    if (a_rectB->m_min[1] <= a_rectA->m_max[1]) {
      if (a_rectB->m_min[2] <= a_rectA->m_max[2]) {
        if (a_rectA->m_min[0] <= a_rectB->m_max[0]) {
          if (a_rectA->m_min[1] <= a_rectB->m_max[1]) {
            if (a_rectA->m_min[2] <= a_rectB->m_max[2]) {
              a_rectA_local._7_1_ = true;
            }
            else {
              a_rectA_local._7_1_ = false;
            }
          }
          else {
            a_rectA_local._7_1_ = false;
          }
        }
        else {
          a_rectA_local._7_1_ = false;
        }
      }
      else {
        a_rectA_local._7_1_ = false;
      }
    }
    else {
      a_rectA_local._7_1_ = false;
    }
  }
  else {
    a_rectA_local._7_1_ = false;
  }
  return a_rectA_local._7_1_;
}

Assistant:

bool OverlapHelper(const ON_RTreeBBox* a_rectA, const ON_RTreeBBox* a_rectB)
{
  const double* mn;
  const double* mx;

  mx = a_rectA->m_max;
  mn = a_rectB->m_min;
  if ( *mx++ < *mn++ ) return false;
  if ( *mx++ < *mn++ ) return false;
  if ( *mx   < *mn   ) return false;

  mx = a_rectB->m_max;
  mn = a_rectA->m_min;
  if ( *mx++ < *mn++ ) return false;
  if ( *mx++ < *mn++ ) return false;
  if ( *mx   < *mn   ) return false;

  return true;
}